

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O0

bool __thiscall deqp::sl::ShaderCase::execute(ShaderCase *this)

{
  value_type vVar1;
  ExpectResult EVar2;
  DataType dataType_00;
  int iVar3;
  RenderContext *pRVar4;
  glGetAttribLocationFunc p_Var5;
  GLint location;
  undefined4 uVar6;
  bool bVar7;
  int iVar8;
  deUint32 dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  GLenum GVar13;
  int iVar14;
  DataType DVar15;
  TestLog *log_00;
  undefined4 extraout_var;
  deUint32 extraout_var_00;
  char *pcVar16;
  ShaderInfo *pSVar17;
  ProgramInfo *pPVar18;
  MessageBuilder *pMVar19;
  TestError *this_00;
  size_type sVar20;
  reference valueBlock_00;
  const_reference val_00;
  reference this_01;
  value_type *pvVar21;
  const_reference pvVar22;
  reference pvVar23;
  GLchar *pGVar24;
  reference vertexArrays_00;
  int location_00;
  allocator<char> local_c41;
  string local_c40;
  allocator<char> local_c19;
  string local_c18;
  LogImage local_bf8;
  MessageBuilder local_b68;
  int local_9e4;
  int local_9e0;
  int local_9dc;
  MessageBuilder local_9d8;
  deInt32 local_854;
  int local_850;
  int maxX;
  int minX;
  int maxY;
  int minY;
  float w;
  undefined1 local_818 [8];
  Surface surface;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b8;
  undefined1 local_798 [8];
  string refName;
  VertexArrayBinding local_728;
  int local_6d4;
  int local_6d0;
  int i;
  int numRows;
  int numCols;
  GLint local_544;
  undefined1 local_540 [4];
  int attribLoc;
  string attribName;
  undefined1 local_518 [8];
  string attribPrefix;
  int local_4f0;
  float v;
  int ndx_1;
  int repNdx_1;
  int ndx;
  int repNdx;
  vector<float,_std::allocator<float>_> *scalars;
  int scalarSize;
  DataType dataType;
  char *valueName;
  Value *val;
  undefined1 local_4b8 [4];
  int valNdx;
  allocator<std::vector<float,_std::allocator<float>_>_> local_461;
  undefined1 local_460 [8];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  attribValues;
  undefined1 local_440 [4];
  int attribValueNdx;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  int numValues;
  int arrayNdx;
  ValueBlock *valueBlock;
  int blockNdx;
  string errStr;
  int positionLoc;
  deUint32 programID;
  uint local_264;
  char *local_260;
  char *failReason;
  undefined1 local_250 [4];
  bool linkOk;
  bool fragmentOk;
  bool vertexOk;
  allocator<char> local_229;
  string local_228;
  ProgramSources local_208;
  undefined1 local_138 [8];
  ShaderProgram program;
  float quadSize;
  int numVerticesPerDraw;
  int viewportY;
  int viewportX;
  int height;
  undefined1 local_40 [4];
  int width;
  Random rnd;
  RenderTarget *renderTarget;
  Functions *gl;
  TestLog *log;
  ShaderCase *this_local;
  Functions *gl_00;
  
  log_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar8 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar8);
  rnd.m_rnd.z = (*this->m_renderCtx->_vptr_RenderContext[4])();
  rnd.m_rnd.w = extraout_var_00;
  pcVar16 = tcu::TestNode::getName((TestNode *)this);
  dVar9 = deStringHash(pcVar16);
  de::Random::Random((Random *)local_40,dVar9);
  iVar8 = tcu::RenderTarget::getWidth((RenderTarget *)rnd.m_rnd._8_8_);
  iVar8 = ::deMin32(iVar8,0x80);
  iVar10 = tcu::RenderTarget::getHeight((RenderTarget *)rnd.m_rnd._8_8_);
  iVar10 = ::deMin32(iVar10,0x80);
  iVar11 = tcu::RenderTarget::getWidth((RenderTarget *)rnd.m_rnd._8_8_);
  iVar11 = de::Random::getInt((Random *)local_40,0,iVar11 - iVar8);
  iVar12 = tcu::RenderTarget::getHeight((RenderTarget *)rnd.m_rnd._8_8_);
  iVar12 = de::Random::getInt((Random *)local_40,0,iVar12 - iVar10);
  program.m_program.m_info.linkTimeUs._4_4_ = 4;
  GVar13 = (*gl_00->getError)();
  glu::checkError(GVar13,"ShaderCase::execute(): start",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                  ,0x117);
  (*gl_00->viewport)(iVar11,iVar12,iVar8,iVar10);
  program.m_program.m_info.linkTimeUs._0_4_ = 0x3f800000;
  pRVar4 = this->m_renderCtx;
  pcVar16 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,pcVar16,&local_229);
  pcVar16 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_250,pcVar16,(allocator<char> *)((long)&failReason + 7));
  glu::makeVtxFragSources(&local_208,&local_228,(string *)local_250);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_138,pRVar4,&local_208);
  glu::ProgramSources::~ProgramSources(&local_208);
  std::__cxx11::string::~string((string *)local_250);
  std::allocator<char>::~allocator((allocator<char> *)((long)&failReason + 7));
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  pSVar17 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_138,SHADERTYPE_VERTEX,0);
  failReason._6_1_ = pSVar17->compileOk & 1;
  pSVar17 = glu::ShaderProgram::getShaderInfo((ShaderProgram *)local_138,SHADERTYPE_FRAGMENT,0);
  failReason._5_1_ = pSVar17->compileOk & 1;
  pPVar18 = glu::ShaderProgram::getProgramInfo((ShaderProgram *)local_138);
  failReason._4_1_ = pPVar18->linkOk & 1;
  local_260 = (char *)0x0;
  glu::operator<<(log_00,(ShaderProgram *)local_138);
  EVar2 = this->m_expectResult;
  if (EVar2 == EXPECT_PASS) {
    if (((failReason._6_1_ & 1) == 0) || ((failReason._5_1_ & 1) == 0)) {
      local_260 = "expected shaders to compile and link properly, but failed to compile.";
    }
    else if ((failReason._4_1_ & 1) == 0) {
      local_260 = "expected shaders to compile and link properly, but failed to link.";
    }
  }
  else if (EVar2 == EXPECT_COMPILE_FAIL) {
    if ((((failReason._6_1_ & 1) == 0) || ((failReason._5_1_ & 1) == 0)) ||
       ((failReason._4_1_ & 1) != 0)) {
      if (((failReason._6_1_ & 1) != 0) && ((failReason._5_1_ & 1) != 0)) {
        local_260 = "expected compilation to fail, but both shaders compiled correctly.";
      }
    }
    else {
      local_260 = "expected compilation to fail, but both shaders compiled and link failed.";
    }
  }
  else {
    if (EVar2 != EXPECT_LINK_FAIL) {
      this_local._7_1_ = 0;
      local_264 = 1;
      goto LAB_016c46e0;
    }
    if (((failReason._6_1_ & 1) == 0) || ((failReason._5_1_ & 1) == 0)) {
      local_260 = "expected linking to fail, but unable to compile.";
    }
    else if ((failReason._4_1_ & 1) != 0) {
      local_260 = "expected linking to fail, but passed.";
    }
  }
  if (local_260 == (char *)0x0) {
    if (this->m_expectResult == EXPECT_PASS) {
      errStr.field_2._12_4_ = glu::ShaderProgram::getProgram((ShaderProgram *)local_138);
      (*gl_00->useProgram)(errStr.field_2._12_4_);
      GVar13 = (*gl_00->getError)();
      glu::checkError(GVar13,"glUseProgram()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                      ,0x15d);
      errStr.field_2._8_4_ = (*gl_00->getAttribLocation)(errStr.field_2._12_4_,"dEQP_Position");
      if (errStr.field_2._8_4_ == -1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&blockNdx,"no location found for attribute \'dEQP_Position\'",
                   (allocator<char> *)((long)&valueBlock + 7));
        std::allocator<char>::~allocator((allocator<char> *)((long)&valueBlock + 7));
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        pcVar16 = (char *)std::__cxx11::string::c_str();
        tcu::TestError::TestError
                  (this_00,pcVar16,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                   ,0x164);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      for (valueBlock._0_4_ = 0; iVar14 = (int)valueBlock,
          sVar20 = std::
                   vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                   ::size(&this->m_valueBlocks), iVar14 < (int)sVar20;
          valueBlock._0_4_ = (int)valueBlock + 1) {
        valueBlock_00 =
             std::
             vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
             ::operator[](&this->m_valueBlocks,(long)(int)valueBlock);
        for (vertexArrays.
             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            vertexArrays.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < valueBlock_00->arrayLength;
            vertexArrays.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                 vertexArrays.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
          sVar20 = std::
                   vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                   ::size(&valueBlock_00->values);
          vertexArrays.
          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (int)sVar20;
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_440);
          attribValues.
          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          sVar20 = (size_type)
                   (int)vertexArrays.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<std::vector<float,_std::allocator<float>_>_>::allocator(&local_461);
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    *)local_460,sVar20,&local_461);
          std::allocator<std::vector<float,_std::allocator<float>_>_>::~allocator(&local_461);
          glu::va::Float((VertexArrayBinding *)local_4b8,errStr.field_2._8_4_,4,4,0,
                         execute::s_positions);
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_440,(value_type *)local_4b8);
          glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_4b8);
          for (val._4_4_ = 0;
              val._4_4_ <
              (int)vertexArrays.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage; val._4_4_ = val._4_4_ + 1) {
            val_00 = std::
                     vector<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                     ::operator[](&valueBlock_00->values,(long)val._4_4_);
            pcVar16 = (char *)std::__cxx11::string::c_str();
            dataType_00 = val_00->dataType;
            iVar14 = glu::getDataTypeScalarSize(val_00->dataType);
            GVar13 = (*gl_00->getError)();
            glu::checkError(GVar13,"before set uniforms",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                            ,0x17f);
            uVar6 = errStr.field_2._12_4_;
            if (val_00->storageType == STORAGE_INPUT) {
              sVar20 = (size_type)
                       attribValues.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
              attribValues.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   attribValues.
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
              this_01 = std::
                        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        ::operator[]((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                      *)local_460,sVar20);
              std::vector<float,_std::allocator<float>_>::resize(this_01,(long)(iVar14 << 2));
              bVar7 = glu::isDataTypeFloatOrVec(dataType_00);
              if ((bVar7) || (bVar7 = glu::isDataTypeMatrix(dataType_00), bVar7)) {
                for (repNdx_1 = 0; repNdx_1 < 4; repNdx_1 = repNdx_1 + 1) {
                  for (ndx_1 = 0; ndx_1 < iVar14; ndx_1 = ndx_1 + 1) {
                    pvVar22 = std::
                              vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                              ::operator[](&val_00->elements,
                                           (long)(vertexArrays.
                                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_ * iVar14 + ndx_1));
                    vVar1 = *pvVar22;
                    pvVar21 = (value_type *)
                              std::vector<float,_std::allocator<float>_>::operator[]
                                        (this_01,(long)(repNdx_1 * iVar14 + ndx_1));
                    *pvVar21 = vVar1;
                  }
                }
              }
              else {
                for (v = 0.0; (int)v < 4; v = (float)((int)v + 1)) {
                  for (local_4f0 = 0; local_4f0 < iVar14; local_4f0 = local_4f0 + 1) {
                    pvVar22 = std::
                              vector<deqp::sl::ShaderCase::Value::Element,_std::allocator<deqp::sl::ShaderCase::Value::Element>_>
                              ::operator[](&val_00->elements,
                                           (long)(vertexArrays.
                                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_4_ * iVar14 + local_4f0));
                    iVar3 = pvVar22->int32;
                    attribPrefix.field_2._12_4_ = (float)iVar3;
                    pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                                        (this_01,(long)((int)v * iVar14 + local_4f0));
                    *pvVar23 = (float)iVar3;
                  }
                }
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_518,"",
                         (allocator<char> *)(attribName.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator
                        ((allocator<char> *)(attribName.field_2._M_local_buf + 0xf));
              if ((this->m_caseType == CASETYPE_FRAGMENT_ONLY) ||
                 (DVar15 = glu::getDataTypeScalarType(dataType_00), DVar15 != TYPE_FLOAT)) {
                std::__cxx11::string::operator=((string *)local_518,"a_");
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_540,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_518,pcVar16);
              uVar6 = errStr.field_2._12_4_;
              p_Var5 = gl_00->getAttribLocation;
              pGVar24 = (GLchar *)std::__cxx11::string::c_str();
              local_544 = (*p_Var5)(uVar6,pGVar24);
              if (local_544 == -1) {
                tcu::TestLog::operator<<
                          ((MessageBuilder *)&numRows,log_00,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar19 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)&numRows,
                                     (char (*) [43])"Warning: no location found for attribute \'");
                pMVar19 = tcu::MessageBuilder::operator<<
                                    (pMVar19,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_540);
                pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,(char (*) [2])0x2b52210);
                tcu::MessageBuilder::operator<<
                          (pMVar19,(EndMessageToken *)&tcu::TestLog::EndMessage);
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&numRows);
                local_264 = 0xb;
              }
              else {
                bVar7 = glu::isDataTypeMatrix(dataType_00);
                location = local_544;
                if (bVar7) {
                  i = glu::getDataTypeMatrixNumColumns(dataType_00);
                  local_6d0 = glu::getDataTypeMatrixNumRows(dataType_00);
                  for (local_6d4 = 0; iVar3 = local_6d0, local_6d4 < i; local_6d4 = local_6d4 + 1) {
                    location_00 = local_544 + local_6d4;
                    pvVar23 = std::vector<float,_std::allocator<float>_>::operator[]
                                        (this_01,(long)(local_6d4 * local_6d0));
                    glu::va::Float(&local_728,location_00,iVar3,4,iVar14 << 2,pvVar23);
                    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                    push_back((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                               *)local_440,&local_728);
                    glu::VertexArrayBinding::~VertexArrayBinding(&local_728);
                  }
                }
                else {
                  pvVar23 = std::vector<float,_std::allocator<float>_>::operator[](this_01,0);
                  glu::va::Float((VertexArrayBinding *)((long)&refName.field_2 + 8),location,iVar14,
                                 4,0,pvVar23);
                  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                  push_back((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                             *)local_440,(value_type *)((long)&refName.field_2 + 8));
                  glu::VertexArrayBinding::~VertexArrayBinding
                            ((VertexArrayBinding *)((long)&refName.field_2 + 8));
                }
                GVar13 = (*gl_00->getError)();
                glu::checkError(GVar13,"set vertex attrib array",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                                ,0x1bc);
                local_264 = 0;
              }
              std::__cxx11::string::~string((string *)local_540);
              std::__cxx11::string::~string((string *)local_518);
            }
            else if (val_00->storageType == STORAGE_OUTPUT) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_7b8,"ref_",&local_7b9);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_798,&local_7b8,pcVar16);
              std::__cxx11::string::~string((string *)&local_7b8);
              std::allocator<char>::~allocator(&local_7b9);
              setUniformValue(gl_00,errStr.field_2._12_4_,(string *)local_798,val_00,
                              vertexArrays.
                              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              GVar13 = (*gl_00->getError)();
              glu::checkError(GVar13,"set reference uniforms",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                              ,0x1c3);
              std::__cxx11::string::~string((string *)local_798);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_7e0,pcVar16,&local_7e1);
              setUniformValue(gl_00,uVar6,&local_7e0,val_00,
                              vertexArrays.
                              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
              std::__cxx11::string::~string((string *)&local_7e0);
              std::allocator<char>::~allocator(&local_7e1);
              GVar13 = (*gl_00->getError)();
              glu::checkError(GVar13,"set uniforms",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                              ,0x1c9);
            }
          }
          (*gl_00->clearColor)(0.0,0.0,0.0,1.0);
          (*gl_00->clear)(0x4000);
          GVar13 = (*gl_00->getError)();
          glu::checkError(GVar13,"clear buffer",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                          ,0x1d0);
          pRVar4 = this->m_renderCtx;
          dVar9 = glu::ShaderProgram::getProgram((ShaderProgram *)local_138);
          sVar20 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
                   size((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *
                        )local_440);
          vertexArrays_00 =
               std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
               operator[]((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                           *)local_440,0);
          glu::pr::Triangles((PrimitiveList *)&surface.m_pixels.m_cap,6,execute::s_indices);
          glu::draw(pRVar4,dVar9,(int)sVar20,vertexArrays_00,
                    (PrimitiveList *)&surface.m_pixels.m_cap,(DrawUtilCallback *)0x0);
          GVar13 = (*gl_00->getError)();
          glu::checkError(GVar13,"draw",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                          ,0x1d5);
          tcu::Surface::Surface((Surface *)local_818,iVar8,iVar10);
          pRVar4 = this->m_renderCtx;
          tcu::Surface::getAccess((PixelBufferAccess *)&minY,(Surface *)local_818);
          glu::readPixels(pRVar4,iVar11,iVar12,(PixelBufferAccess *)&minY);
          GVar13 = (*gl_00->getError)();
          glu::checkError(GVar13,"read pixels",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                          ,0x1da);
          maxY = (int)1.0;
          minX = ::deCeilFloatToInt32((float)iVar10 * 0.0 + 1.0);
          maxX = ::deFloorFloatToInt32(((1.0 / (float)maxY) * 0.5 + 0.5) * (float)iVar10 + -0.5);
          local_850 = ::deCeilFloatToInt32(((-1.0 / (float)maxY) * 0.5 + 0.5) * (float)iVar8 + 1.0);
          local_854 = ::deFloorFloatToInt32(((1.0 / (float)maxY) * 0.5 + 0.5) * (float)iVar8 + -0.5)
          ;
          bVar7 = checkPixels(this,(Surface *)local_818,local_850,local_854,minX,maxX);
          if (!bVar7) {
            tcu::TestLog::operator<<(&local_9d8,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar19 = tcu::MessageBuilder::operator<<
                                (&local_9d8,(char (*) [35])"INCORRECT RESULT for (value block ");
            local_9dc = (int)valueBlock + 1;
            pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,&local_9dc);
            pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,(char (*) [5])0x2c0d8d7);
            sVar20 = std::
                     vector<deqp::sl::ShaderCase::ValueBlock,_std::allocator<deqp::sl::ShaderCase::ValueBlock>_>
                     ::size(&this->m_valueBlocks);
            local_9e0 = (int)sVar20;
            pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,&local_9e0);
            pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,(char (*) [12])", sub-case ");
            local_9e4 = vertexArrays.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
            pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,&local_9e4);
            pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,(char (*) [5])0x2c0d8d7);
            pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,&valueBlock_00->arrayLength);
            pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,(char (*) [3])0x2baed69);
            tcu::MessageBuilder::operator<<(pMVar19,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_9d8);
            tcu::TestLog::operator<<(&local_b68,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar19 = tcu::MessageBuilder::operator<<
                                (&local_b68,(char (*) [36])"Failing shader input/output values:");
            tcu::MessageBuilder::operator<<(pMVar19,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_b68);
            dumpValues(this,valueBlock_00,
                       vertexArrays.
                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c18,"Result",&local_c19);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c40,"Rendered result image",&local_c41);
            tcu::LogImage::LogImage
                      (&local_bf8,&local_c18,&local_c40,(Surface *)local_818,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::TestLog::operator<<(log_00,&local_bf8);
            tcu::LogImage::~LogImage(&local_bf8);
            std::__cxx11::string::~string((string *)&local_c40);
            std::allocator<char>::~allocator(&local_c41);
            std::__cxx11::string::~string((string *)&local_c18);
            std::allocator<char>::~allocator(&local_c19);
            (*gl_00->useProgram)(0);
            tcu::TestContext::setTestResult
                      ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                       "Image comparison failed");
            this_local._7_1_ = 0;
          }
          local_264 = (uint)!bVar7;
          tcu::Surface::~Surface((Surface *)local_818);
          std::
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     *)local_460);
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     local_440);
          if (local_264 != 0) goto LAB_016c46e0;
        }
      }
      (*gl_00->useProgram)(0);
      GVar13 = (*gl_00->getError)();
      glu::checkError(GVar13,"ShaderCase::execute(): end",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcShaderLibraryCase.cpp"
                      ,0x1f6);
      this_local._7_1_ = 1;
      local_264 = 1;
    }
    else {
      this_local._7_1_ = 1;
      local_264 = 1;
    }
  }
  else {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&positionLoc,log_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar19 = tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)&positionLoc,(char (*) [8])0x2b89be9);
    pMVar19 = tcu::MessageBuilder::operator<<(pMVar19,&local_260);
    tcu::MessageBuilder::operator<<(pMVar19,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&positionLoc);
    if ((((this->m_expectResult == EXPECT_COMPILE_FAIL) && ((failReason._6_1_ & 1) != 0)) &&
        ((failReason._5_1_ & 1) != 0)) && ((failReason._4_1_ & 1) == 0)) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_QUALITY_WARNING,
                 local_260);
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,local_260);
    }
    this_local._7_1_ = 0;
    local_264 = 1;
  }
LAB_016c46e0:
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_138);
  de::Random::~Random((Random *)local_40);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ShaderCase::execute(void)
{
	TestLog&			  log = m_testCtx.getLog();
	const glw::Functions& gl  = m_renderCtx.getFunctions();

	// Compute viewport.
	const tcu::RenderTarget& renderTarget = m_renderCtx.getRenderTarget();
	de::Random				 rnd(deStringHash(getName()));
	int						 width				= deMin32(renderTarget.getWidth(), VIEWPORT_WIDTH);
	int						 height				= deMin32(renderTarget.getHeight(), VIEWPORT_HEIGHT);
	int						 viewportX			= rnd.getInt(0, renderTarget.getWidth() - width);
	int						 viewportY			= rnd.getInt(0, renderTarget.getHeight() - height);
	const int				 numVerticesPerDraw = 4;

	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderCase::execute(): start");

	// Setup viewport.
	gl.viewport(viewportX, viewportY, width, height);

	const float		   quadSize			  = 1.0f;
	static const float s_positions[4 * 4] = { -quadSize, -quadSize, 0.0f, 1.0f, -quadSize, +quadSize, 0.0f, 1.0f,
											  +quadSize, -quadSize, 0.0f, 1.0f, +quadSize, +quadSize, 0.0f, 1.0f };

	static const deUint16 s_indices[2 * 3] = { 0, 1, 2, 1, 3, 2 };

	// Setup program.
	glu::ShaderProgram program(m_renderCtx, glu::makeVtxFragSources(m_vertexSource.c_str(), m_fragmentSource.c_str()));

	// Check that compile/link results are what we expect.
	bool		vertexOk   = program.getShaderInfo(SHADERTYPE_VERTEX).compileOk;
	bool		fragmentOk = program.getShaderInfo(SHADERTYPE_FRAGMENT).compileOk;
	bool		linkOk	 = program.getProgramInfo().linkOk;
	const char* failReason = DE_NULL;

	log << program;

	switch (m_expectResult)
	{
	case EXPECT_PASS:
		if (!vertexOk || !fragmentOk)
			failReason = "expected shaders to compile and link properly, but failed to compile.";
		else if (!linkOk)
			failReason = "expected shaders to compile and link properly, but failed to link.";
		break;

	case EXPECT_COMPILE_FAIL:
		if (vertexOk && fragmentOk && !linkOk)
			failReason = "expected compilation to fail, but both shaders compiled and link failed.";
		else if (vertexOk && fragmentOk)
			failReason = "expected compilation to fail, but both shaders compiled correctly.";
		break;

	case EXPECT_LINK_FAIL:
		if (!vertexOk || !fragmentOk)
			failReason = "expected linking to fail, but unable to compile.";
		else if (linkOk)
			failReason = "expected linking to fail, but passed.";
		break;

	default:
		DE_ASSERT(false);
		return false;
	}

	if (failReason != DE_NULL)
	{
		// \todo [2010-06-07 petri] These should be handled in the test case?
		log << TestLog::Message << "ERROR: " << failReason << TestLog::EndMessage;

		// If implementation parses shader at link time, report it as quality warning.
		if (m_expectResult == EXPECT_COMPILE_FAIL && vertexOk && fragmentOk && !linkOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, failReason);
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failReason);
		return false;
	}

	// Return if compile/link expected to fail.
	if (m_expectResult != EXPECT_PASS)
		return (failReason == DE_NULL);

	// Start using program.
	deUint32 programID = program.getProgram();
	gl.useProgram(programID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram()");

	// Fetch location for positions positions.
	int positionLoc = gl.getAttribLocation(programID, "dEQP_Position");
	if (positionLoc == -1)
	{
		string errStr = string("no location found for attribute 'dEQP_Position'");
		TCU_FAIL(errStr.c_str());
	}

	// Iterate all value blocks.
	for (int blockNdx = 0; blockNdx < (int)m_valueBlocks.size(); blockNdx++)
	{
		const ValueBlock& valueBlock = m_valueBlocks[blockNdx];

		// Iterate all array sub-cases.
		for (int arrayNdx = 0; arrayNdx < valueBlock.arrayLength; arrayNdx++)
		{
			int						   numValues = (int)valueBlock.values.size();
			vector<VertexArrayBinding> vertexArrays;

			int					   attribValueNdx = 0;
			vector<vector<float> > attribValues(numValues);

			vertexArrays.push_back(va::Float(positionLoc, 4, numVerticesPerDraw, 0, &s_positions[0]));

			// Collect VA pointer for inputs and set uniform values for outputs (refs).
			for (int valNdx = 0; valNdx < numValues; valNdx++)
			{
				const ShaderCase::Value& val		= valueBlock.values[valNdx];
				const char*				 valueName  = val.valueName.c_str();
				DataType				 dataType   = val.dataType;
				int						 scalarSize = getDataTypeScalarSize(val.dataType);

				GLU_EXPECT_NO_ERROR(gl.getError(), "before set uniforms");

				if (val.storageType == ShaderCase::Value::STORAGE_INPUT)
				{
					// Replicate values four times.
					std::vector<float>& scalars = attribValues[attribValueNdx++];
					scalars.resize(numVerticesPerDraw * scalarSize);
					if (isDataTypeFloatOrVec(dataType) || isDataTypeMatrix(dataType))
					{
						for (int repNdx = 0; repNdx < numVerticesPerDraw; repNdx++)
							for (int ndx						   = 0; ndx < scalarSize; ndx++)
								scalars[repNdx * scalarSize + ndx] = val.elements[arrayNdx * scalarSize + ndx].float32;
					}
					else
					{
						// convert to floats.
						for (int repNdx = 0; repNdx < numVerticesPerDraw; repNdx++)
						{
							for (int ndx = 0; ndx < scalarSize; ndx++)
							{
								float v = (float)val.elements[arrayNdx * scalarSize + ndx].int32;
								DE_ASSERT(val.elements[arrayNdx * scalarSize + ndx].int32 == (int)v);
								scalars[repNdx * scalarSize + ndx] = v;
							}
						}
					}

					// Attribute name prefix.
					string attribPrefix = "";
					// \todo [2010-05-27 petri] Should latter condition only apply for vertex cases (or actually non-fragment cases)?
					if ((m_caseType == CASETYPE_FRAGMENT_ONLY) || (getDataTypeScalarType(dataType) != TYPE_FLOAT))
						attribPrefix = "a_";

					// Input always given as attribute.
					string attribName = attribPrefix + valueName;
					int	attribLoc  = gl.getAttribLocation(programID, attribName.c_str());
					if (attribLoc == -1)
					{
						log << TestLog::Message << "Warning: no location found for attribute '" << attribName << "'"
							<< TestLog::EndMessage;
						continue;
					}

					if (isDataTypeMatrix(dataType))
					{
						int numCols = getDataTypeMatrixNumColumns(dataType);
						int numRows = getDataTypeMatrixNumRows(dataType);
						DE_ASSERT(scalarSize == numCols * numRows);

						for (int i = 0; i < numCols; i++)
							vertexArrays.push_back(va::Float(attribLoc + i, numRows, numVerticesPerDraw,
															 static_cast<int>(scalarSize * sizeof(float)),
															 &scalars[i * numRows]));
					}
					else
					{
						DE_ASSERT(isDataTypeFloatOrVec(dataType) || isDataTypeIntOrIVec(dataType) ||
								  isDataTypeUintOrUVec(dataType) || isDataTypeBoolOrBVec(dataType));
						vertexArrays.push_back(va::Float(attribLoc, scalarSize, numVerticesPerDraw, 0, &scalars[0]));
					}

					GLU_EXPECT_NO_ERROR(gl.getError(), "set vertex attrib array");
				}
				else if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
				{
					// Set reference value.
					string refName = string("ref_") + valueName;
					setUniformValue(gl, programID, refName, val, arrayNdx);
					GLU_EXPECT_NO_ERROR(gl.getError(), "set reference uniforms");
				}
				else
				{
					DE_ASSERT(val.storageType == ShaderCase::Value::STORAGE_UNIFORM);
					setUniformValue(gl, programID, valueName, val, arrayNdx);
					GLU_EXPECT_NO_ERROR(gl.getError(), "set uniforms");
				}
			}

			// Clear.
			gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
			gl.clear(GL_COLOR_BUFFER_BIT);
			GLU_EXPECT_NO_ERROR(gl.getError(), "clear buffer");

			// Draw.
			draw(m_renderCtx, program.getProgram(), (int)vertexArrays.size(), &vertexArrays[0],
				 pr::Triangles(DE_LENGTH_OF_ARRAY(s_indices), &s_indices[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "draw");

			// Read back results.
			Surface surface(width, height);
			glu::readPixels(m_renderCtx, viewportX, viewportY, surface.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "read pixels");

			float w	= s_positions[3];
			int   minY = deCeilFloatToInt32(((-quadSize / w) * 0.5f + 0.5f) * (float)height + 1.0f);
			int   maxY = deFloorFloatToInt32(((+quadSize / w) * 0.5f + 0.5f) * (float)height - 0.5f);
			int   minX = deCeilFloatToInt32(((-quadSize / w) * 0.5f + 0.5f) * (float)width + 1.0f);
			int   maxX = deFloorFloatToInt32(((+quadSize / w) * 0.5f + 0.5f) * (float)width - 0.5f);

			if (!checkPixels(surface, minX, maxX, minY, maxY))
			{
				log << TestLog::Message << "INCORRECT RESULT for (value block " << (blockNdx + 1) << " of "
					<< (int)m_valueBlocks.size() << ", sub-case " << arrayNdx + 1 << " of " << valueBlock.arrayLength
					<< "):" << TestLog::EndMessage;

				log << TestLog::Message << "Failing shader input/output values:" << TestLog::EndMessage;
				dumpValues(valueBlock, arrayNdx);

				// Dump image on failure.
				log << TestLog::Image("Result", "Rendered result image", surface);

				gl.useProgram(0);
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				return false;
			}
		}
	}

	gl.useProgram(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderCase::execute(): end");
	return true;
}